

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6acc::TENSOR_INITIALIZING_2_Test::TestBody(TENSOR_INITIALIZING_2_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  vector<int,_std::allocator<int>_> *local_1b8;
  AssertHelper local_188;
  Message local_180;
  int local_174;
  array<unsigned_int,_2UL> local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_2;
  Message local_150;
  int local_144;
  array<unsigned_int,_2UL> local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_1;
  Message local_120;
  int local_114;
  array<unsigned_int,_2UL> local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  allocator<std::vector<int,_std::allocator<int>_>_> local_ef;
  undefined1 local_ee;
  allocator<int> local_ed;
  int local_ec [3];
  iterator local_e0;
  size_type local_d8;
  allocator<int> local_bd;
  int local_bc [3];
  iterator local_b0;
  size_type local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  undefined1 local_68 [40];
  undefined1 local_40 [8];
  tensor<int,_2U> ts;
  TENSOR_INITIALIZING_2_Test *this_local;
  
  local_ee = 1;
  local_bc[0] = 1;
  local_bc[1] = 2;
  local_bc[2] = 3;
  local_b0 = local_bc;
  local_a8 = 3;
  local_a0 = &local_98;
  ts._shape._M_elems = (_Type)this;
  std::allocator<int>::allocator(&local_bd);
  __l_00._M_len = local_a8;
  __l_00._M_array = local_b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_00,&local_bd);
  local_ec[0] = 4;
  local_ec[1] = 5;
  local_ec[2] = 6;
  local_e0 = local_ec;
  local_d8 = 3;
  local_a0 = &local_80;
  std::allocator<int>::allocator(&local_ed);
  __l._M_len = local_d8;
  __l._M_array = local_e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,&local_ed);
  local_ee = 0;
  local_68._0_8_ = &local_98;
  local_68._8_8_ = (pointer)0x2;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_ef);
  __l_01._M_len = local_68._8_8_;
  __l_01._M_array = (iterator)local_68._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_68 + 0x10),__l_01,&local_ef);
  gtest_ar.message_.ptr_._0_4_ = 2;
  gtest_ar.message_.ptr_._4_4_ = 3;
  dnet::data_types::tensor<int,_2U>::tensor
            ((tensor<int,_2U> *)local_40,(type *)(local_68 + 0x10),
             (array<unsigned_int,_2UL>)0x300000002);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_68 + 0x10));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_ef);
  local_1b8 = (vector<int,_std::allocator<int>_> *)local_68;
  do {
    local_1b8 = local_1b8 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_1b8);
  } while (local_1b8 != &local_98);
  std::allocator<int>::~allocator(&local_ed);
  std::allocator<int>::~allocator(&local_bd);
  local_110._M_elems[0] = 0;
  local_110._M_elems[1] = 0;
  piVar2 = dnet::data_types::tensor<int,_2U>::operator[]((tensor<int,_2U> *)local_40,&local_110);
  local_114 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_108,"(ts[{0,0}])","1",piVar2,&local_114);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_140._M_elems[0] = 0;
  local_140._M_elems[1] = 2;
  piVar2 = dnet::data_types::tensor<int,_2U>::operator[]((tensor<int,_2U> *)local_40,&local_140);
  local_144 = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_138,"(ts[{0,2}])","3",piVar2,&local_144);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_170._M_elems[0] = 1;
  local_170._M_elems[1] = 1;
  piVar2 = dnet::data_types::tensor<int,_2U>::operator[]((tensor<int,_2U> *)local_40,&local_170);
  local_174 = 5;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_168,"(ts[{1,1}])","5",piVar2,&local_174);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  dnet::data_types::tensor<int,_2U>::~tensor((tensor<int,_2U> *)local_40);
  return;
}

Assistant:

TEST(TENSOR, INITIALIZING_2) {
        tensor<int, 2> ts({
                                  {1,2,3},
                                  {4,5,6}
                          }, {2,3});
        EXPECT_EQ((ts[{0,0}]), 1);
        EXPECT_EQ((ts[{0,2}]), 3);
        EXPECT_EQ((ts[{1,1}]), 5);
    }